

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execTrapv<(moira::Core)0,(moira::Instr)127,(moira::Mode)12,4>(Moira *this,u16 opcode)

{
  u32 uVar1;
  undefined8 uVar2;
  
  uVar1 = (this->reg).pc;
  if ((this->reg).sr.v == true) {
    read<(moira::Core)0,(moira::AddrSpace)2,2,0ull>(this,uVar1 + 2);
    execException<(moira::Core)0>(this,TRAPV,0);
    uVar2 = 0x22;
  }
  else {
    (this->reg).pc0 = uVar1;
    (this->queue).ird = (this->queue).irc;
    uVar1 = read<(moira::Core)0,(moira::AddrSpace)2,2,4ull>(this,uVar1 + 2);
    (this->queue).irc = (u16)uVar1;
    this->readBuffer = (u16)uVar1;
    uVar2 = 4;
  }
  (*this->_vptr_Moira[2])(this,uVar2);
  return;
}

Assistant:

void
Moira::execTrapv(u16 opcode)
{
    AVAILABILITY(Core::C68000)

    if (reg.sr.v) {

        if (C == Core::C68000) {
            (void)read<C, AddrSpace::PROG, Word>(reg.pc + 2);
        } else {
            (void)read<C, AddrSpace::PROG, Word>(reg.pc + 2);
            SYNC(2);
        }
        execException<C>(M68kException::TRAPV);

        //           00  10  20        00  10  20        00  10  20
        //           .b  .b  .b        .w  .w  .w        .l  .l  .l
        CYCLES_IP   ( 0,  0,  0,        0,  0,  0,       34, 34, 20)

    } else {

        prefetch<C, POLL>();

        //           00  10  20        00  10  20        00  10  20
        //           .b  .b  .b        .w  .w  .w        .l  .l  .l
        CYCLES_IP   ( 0,  0,  0,        0,  0,  0,        4,  4,  4)
    }

    FINALIZE
}